

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

void conncache_remove_bundle(conncache *connc,connectbundle *bundle)

{
  curl_hash_element *pcVar1;
  curl_hash_iterator iter;
  curl_hash_iterator local_30;
  
  if (connc != (conncache *)0x0) {
    Curl_hash_start_iterate(connc->hash,&local_30);
    do {
      pcVar1 = Curl_hash_next_element(&local_30);
      if (pcVar1 == (curl_hash_element *)0x0) {
        return;
      }
    } while ((connectbundle *)pcVar1->ptr != bundle);
    Curl_hash_delete(connc->hash,pcVar1->key,pcVar1->key_len);
  }
  return;
}

Assistant:

static void conncache_remove_bundle(struct conncache *connc,
                                    struct connectbundle *bundle)
{
  struct curl_hash_iterator iter;
  struct curl_hash_element *he;

  if(!connc)
    return;

  Curl_hash_start_iterate(connc->hash, &iter);

  he = Curl_hash_next_element(&iter);
  while(he) {
    if(he->ptr == bundle) {
      /* The bundle is destroyed by the hash destructor function,
         free_bundle_hash_entry() */
      Curl_hash_delete(connc->hash, he->key, he->key_len);
      return;
    }

    he = Curl_hash_next_element(&iter);
  }
}